

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O3

bool __thiscall
draco::AttributeOctahedronTransform::DecodeParameters
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          DecoderBuffer *decoder_buffer)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = decoder_buffer->data_size_;
  lVar1 = decoder_buffer->pos_ + 1;
  if (lVar1 <= lVar3) {
    bVar2 = decoder_buffer->data_[decoder_buffer->pos_];
    decoder_buffer->pos_ = lVar1;
    this->quantization_bits_ = (uint)bVar2;
  }
  return lVar1 <= lVar3;
}

Assistant:

bool Peek(T *out_val) {
    const size_t size_to_decode = sizeof(T);
    if (data_size_ < static_cast<int64_t>(pos_ + size_to_decode)) {
      return false;  // Buffer overflow.
    }
    memcpy(out_val, (data_ + pos_), size_to_decode);
    return true;
  }